

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestValueTestcompareNull::runTestCase(TestValueTestcompareNull *this)

{
  TestResult *pTVar1;
  Value VStack_88;
  Value local_60;
  PredicateContext local_38;
  
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_38.id_ = pTVar1->predicateId_;
  local_38.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_38.line_ = 0x553;
  local_38.expr_ = "checkIsEqual(Json::Value(), Json::Value())";
  local_38.next_ = (PredicateContext *)0x0;
  local_38.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_38;
  pTVar1->predicateId_ = local_38.id_ + 1;
  pTVar1->predicateStackTail_ = &local_38;
  Json::Value::Value(&local_60,nullValue);
  Json::Value::Value(&VStack_88,nullValue);
  ValueTest::checkIsEqual(&this->super_ValueTest,&local_60,&VStack_88);
  Json::Value::~Value(&VStack_88);
  Json::Value::~Value(&local_60);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareNull) {
  JSONTEST_ASSERT_PRED(checkIsEqual(Json::Value(), Json::Value()));
}